

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileLockPool.cxx
# Opt level: O3

cmFileLockResult __thiscall cmFileLockPool::Release(cmFileLockPool *this,string *filename)

{
  pointer pSVar1;
  bool bVar2;
  cmFileLockResult cVar3;
  List *__range1;
  ScopePool *funcScope;
  pointer pSVar4;
  cmFileLockResult result;
  cmFileLockResult local_30;
  
  pSVar4 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FunctionScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar1) {
    do {
      local_30 = ScopePool::Release(pSVar4,filename);
      bVar2 = cmFileLockResult::IsOk(&local_30);
      if (!bVar2) {
        return local_30;
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  pSVar4 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->FileScopes).
           super__Vector_base<cmFileLockPool::ScopePool,_std::allocator<cmFileLockPool::ScopePool>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar4 != pSVar1) {
    do {
      local_30 = ScopePool::Release(pSVar4,filename);
      bVar2 = cmFileLockResult::IsOk(&local_30);
      if (!bVar2) {
        return local_30;
      }
      pSVar4 = pSVar4 + 1;
    } while (pSVar4 != pSVar1);
  }
  cVar3 = ScopePool::Release(&this->ProcessScope,filename);
  return cVar3;
}

Assistant:

cmFileLockResult cmFileLockPool::Release(const std::string& filename)
{
  for (auto& funcScope : this->FunctionScopes) {
    const cmFileLockResult result = funcScope.Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  for (auto& fileScope : this->FileScopes) {
    const cmFileLockResult result = fileScope.Release(filename);
    if (!result.IsOk()) {
      return result;
    }
  }

  return this->ProcessScope.Release(filename);
}